

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O3

void __thiscall spatial_region::create_arrays(spatial_region *this,int nx0,int ny0,int nz0,int seed)

{
  size_t __size;
  int iVar1;
  double *pdVar2;
  int *piVar3;
  long lVar4;
  int i;
  long lVar5;
  undefined1 local_78 [16];
  _Head_base<0UL,_celle_***,_false> local_68;
  _Head_base<0UL,_celle_**,_false> local_60;
  _Head_base<0UL,_celle_*,_false> local_58;
  allocator_type local_49;
  vector<field3d<double>,_std::allocator<field3d<double>_>_> local_48;
  
  this->nx = nx0;
  this->ny = ny0;
  this->nz = nz0;
  field3d<celle>::field3d((field3d<celle> *)local_78,nx0,ny0,nz0);
  field3d<celle>::operator=(&this->ce,(field3d<celle> *)local_78);
  if ((_Tuple_impl<0UL,_celle_*,_std::default_delete<celle[]>_>)local_58._M_head_impl !=
      (celle *)0x0) {
    operator_delete__(local_58._M_head_impl);
  }
  local_58._M_head_impl = (celle *)0x0;
  if ((_Head_base<0UL,_celle_**,_false>)local_60._M_head_impl !=
      (_Head_base<0UL,_celle_**,_false>)0x0) {
    operator_delete__(local_60._M_head_impl);
  }
  local_60._M_head_impl = (celle **)0x0;
  if (local_68._M_head_impl != (celle ***)0x0) {
    operator_delete__(local_68._M_head_impl);
  }
  field3d<cellb>::field3d((field3d<cellb> *)local_78,this->nx,this->ny,this->nz);
  field3d<cellb>::operator=(&this->cb,(field3d<cellb> *)local_78);
  if (local_58._M_head_impl != (celle *)0x0) {
    operator_delete__(local_58._M_head_impl);
  }
  local_58._M_head_impl = (celle *)0x0;
  if (local_60._M_head_impl != (celle **)0x0) {
    operator_delete__(local_60._M_head_impl);
  }
  local_60._M_head_impl = (celle **)0x0;
  if (local_68._M_head_impl != (celle ***)0x0) {
    operator_delete__(local_68._M_head_impl);
  }
  field3d<cellj>::field3d((field3d<cellj> *)local_78,this->nx,this->ny,this->nz);
  field3d<cellj>::operator=(&this->cj,(field3d<cellj> *)local_78);
  if (local_58._M_head_impl != (celle *)0x0) {
    operator_delete__(local_58._M_head_impl);
  }
  local_58._M_head_impl = (celle *)0x0;
  if (local_60._M_head_impl != (celle **)0x0) {
    operator_delete__(local_60._M_head_impl);
  }
  local_60._M_head_impl = (celle **)0x0;
  if ((_Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>)local_68._M_head_impl !=
      (celle ***)0x0) {
    operator_delete__(local_68._M_head_impl);
  }
  field3d<cellbe>::field3d((field3d<cellbe> *)local_78,this->nx,this->ny,this->nz);
  field3d<cellbe>::operator=(&this->cbe,(field3d<cellbe> *)local_78);
  if (local_58._M_head_impl != (celle *)0x0) {
    operator_delete__(local_58._M_head_impl);
  }
  local_58._M_head_impl = (celle *)0x0;
  if (local_60._M_head_impl != (celle **)0x0) {
    operator_delete__(local_60._M_head_impl);
  }
  local_60._M_head_impl = (celle **)0x0;
  if ((_Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>)local_68._M_head_impl !=
      (celle ***)0x0) {
    operator_delete__(local_68._M_head_impl);
  }
  field3d<cellp>::field3d((field3d<cellp> *)local_78,this->nx,this->ny,this->nz);
  field3d<cellp>::operator=(&this->cp,(field3d<cellp> *)local_78);
  if (local_58._M_head_impl != (celle *)0x0) {
    operator_delete__(local_58._M_head_impl);
  }
  local_58._M_head_impl = (celle *)0x0;
  if (local_60._M_head_impl != (celle **)0x0) {
    operator_delete__(local_60._M_head_impl);
  }
  local_60._M_head_impl = (celle **)0x0;
  if ((_Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>)local_68._M_head_impl !=
      (celle ***)0x0) {
    operator_delete__(local_68._M_head_impl);
  }
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::vector
            (&local_48,(long)this->n_ion_populations,&local_49);
  local_68._M_head_impl =
       (celle ***)
       (this->irho).super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->irho).super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78._0_8_ =
       (this->irho).super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78._8_8_ =
       (this->irho).super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->irho).super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->irho).super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::~vector
            ((vector<field3d<double>,_std::allocator<field3d<double>_>_> *)local_78);
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::~vector(&local_48);
  if (0 < this->n_ion_populations) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      field3d<double>::field3d((field3d<double> *)local_78,this->nx,this->ny,this->nz);
      field3d<double>::operator=
                ((field3d<double> *)
                 ((long)&((this->irho).
                          super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>.
                          _M_impl.super__Vector_impl_data._M_start)->nx + lVar5),
                 (field3d<double> *)local_78);
      if ((_Tuple_impl<0UL,_celle_*,_std::default_delete<celle[]>_>)local_58._M_head_impl !=
          (celle *)0x0) {
        operator_delete__(local_58._M_head_impl);
      }
      local_58._M_head_impl = (celle *)0x0;
      if ((_Tuple_impl<0UL,_celle_**,_std::default_delete<celle_*[]>_>)local_60._M_head_impl !=
          (celle **)0x0) {
        operator_delete__(local_60._M_head_impl);
      }
      local_60._M_head_impl = (celle **)0x0;
      if ((_Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>)local_68._M_head_impl !=
          (celle ***)0x0) {
        operator_delete__(local_68._M_head_impl);
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar4 < this->n_ion_populations);
  }
  pdVar2 = (double *)malloc(0x1b8);
  this->random = pdVar2;
  srand(seed);
  lVar4 = 0;
  do {
    iVar1 = rand();
    this->random[lVar4] = (double)iVar1 / 2147483647.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x37);
  lVar4 = (long)this->n_ion_populations;
  __size = lVar4 * 8;
  pdVar2 = (double *)malloc(__size);
  this->ienergy = pdVar2;
  pdVar2 = (double *)malloc(__size);
  this->ienergy_deleted = pdVar2;
  if (0 < lVar4) {
    memset(pdVar2,0,__size);
  }
  piVar3 = (int *)malloc(lVar4 << 2);
  this->N_qp_i = piVar3;
  return;
}

Assistant:

void spatial_region::create_arrays(int nx0, int ny0, int nz0, int seed)
{
    nx = nx0;
    ny = ny0;
    nz = nz0;

    void* pv;

    ce = field3d<celle>(nx, ny, nz);
    cb = field3d<cellb>(nx, ny, nz);
    cj = field3d<cellj>(nx, ny, nz);
    cbe = field3d<cellbe>(nx, ny, nz);
    cp = field3d<cellp>(nx, ny, nz);

    irho = vector<field3d<double> >(n_ion_populations);
    for (int n=0;n<n_ion_populations;n++)
    {
        irho[n] = field3d<double>(nx, ny, nz);
    }

    pv = malloc(sizeof(double)*55);
    random = (double*) pv;
    srand(seed);
    for(int i=0;i<55;i++)
    {
        random[i] = (double)rand()/(double)RAND_MAX;
    }

    pv = malloc(sizeof(double)*n_ion_populations);
    ienergy = (double*) pv;
    pv = malloc(sizeof(double)*n_ion_populations);
    ienergy_deleted = (double*) pv;
    for (int i=0; i<n_ion_populations; ++i)
    {
        ienergy_deleted[i] = 0.0;
    }

    pv = malloc(sizeof(int)*n_ion_populations);
    N_qp_i = (int*) pv;
}